

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  k051649_state *info_00;
  k051649_state *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  info_00 = (k051649_state *)calloc(1,0x108);
  if (info_00 == (k051649_state *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    info_00->mode_plus = cfg->flags;
    info_00->mclock = cfg->clock;
    info_00->rate = info_00->mclock >> 4;
    make_mixer_table(info_00,5);
    k051649_set_mute_mask(info_00,0);
    info_00->_devData = (DEV_DATA)info_00;
    INIT_DEVINF(retDevInf,(DEV_DATA *)info_00,info_00->rate,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	// build the mixer table
	make_mixer_table(info, 5);
	
	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}